

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void gl4cts::FunctionObject::unpack<tcu::Matrix<double,_2,_2>_>::get
               (GLvoid *buffer,Matrix<double,_2,_2> *out)

{
  GLint column;
  long lVar1;
  GLint row;
  long lVar2;
  GLdouble *data;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      ((Vector<tcu::Vector<double,_2>,_2> *)((Vector<double,_2> *)out)->m_data)->m_data[0].m_data
      [lVar2] = *(double *)((long)buffer + lVar2 * 8);
    }
    buffer = (GLvoid *)((long)buffer + 0x10);
    out = (Matrix<double,_2,_2> *)((long)out + 0x10);
  }
  return;
}

Assistant:

static void get(const glw::GLvoid* buffer, tcu::Matrix<glw::GLdouble, Rows, Cols>& out)
	{
		const glw::GLdouble* data = (glw::GLdouble*)buffer;

		for (glw::GLint column = 0; column < Cols; ++column)
		{
			for (glw::GLint row = 0; row < Rows; ++row)
			{
				glw::GLint index = column * Rows + row;

				out(row, column) = data[index];
			}
		}
	}